

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological-sort.cpp
# Opt level: O0

void __thiscall
TopologicalSortTest_TwoChains_Test::~TopologicalSortTest_TwoChains_Test
          (TopologicalSortTest_TwoChains_Test *this)

{
  TopologicalSortTest_TwoChains_Test *this_local;
  
  ~TopologicalSortTest_TwoChains_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TopologicalSortTest, TwoChains) {
  Graph graph(4);
  graph[0].push_back(2);
  graph[1].push_back(3);
  TopologicalOrders orders(graph);
  std::set<std::vector<Index>> results(orders.begin(), orders.end());
  std::set<std::vector<Index>> expected{
    {0, 1, 2, 3},
    {0, 1, 3, 2},
    {0, 2, 1, 3},
    {1, 0, 2, 3},
    {1, 0, 3, 2},
    {1, 3, 0, 2},
  };
  EXPECT_EQ(results, expected);
}